

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  Nf_Man_t *p_00;
  abctime aVar3;
  Nf_Obj_t *pNVar4;
  Vec_Int_t *vRefs;
  Vec_Mem_t *pVVar5;
  Vec_Wec_t *pVVar6;
  Nf_Mat_t *pNVar7;
  int local_2c;
  int Entry;
  int i;
  Nf_Man_t *p;
  Vec_Int_t *vFlowRefs;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if ((pPars->nCutNum < 2) || (0x20 < pPars->nCutNum)) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x174,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if ((1 < pPars->nLutSize) && (pPars->nLutSize < 7)) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vCellMapping);
    iVar1 = Gia_ManHasChoices(pGia);
    if (iVar1 != 0) {
      Gia_ManSetPhase(pGia);
    }
    p_00 = (Nf_Man_t *)calloc(1,0x118);
    aVar3 = Abc_Clock();
    p_00->clkStart = aVar3;
    p_00->pGia = pGia;
    p_00->pPars = pPars;
    iVar1 = Gia_ManObjNum(pGia);
    pNVar4 = (Nf_Obj_t *)calloc((long)iVar1,0x60);
    p_00->pNfObjs = pNVar4;
    p_00->iCur = 2;
    Vec_PtrGrow(&p_00->vPages,0x100);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vMapRefs,iVar1 << 1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_FltFill(&p_00->vFlowRefs,iVar1 << 1,0.0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_WrdFill(&p_00->vRequired,iVar1 << 1,0xffffffffffffffff);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutSets,iVar1,0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_FltFill(&p_00->vCutFlows,iVar1,0.0);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&p_00->vCutDelays,iVar1,0);
    Vec_IntGrow(&p_00->vBackup,1000);
    vRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs(pGia,vRefs);
    for (local_2c = 0; iVar1 = Vec_IntSize(vRefs), local_2c < iVar1; local_2c = local_2c + 1) {
      iVar1 = Vec_IntEntry(vRefs,local_2c);
      Vec_FltWriteEntry(&p_00->vFlowRefs,local_2c << 1,(float)iVar1);
      Vec_FltWriteEntry(&p_00->vFlowRefs,local_2c * 2 + 1,(float)iVar1);
    }
    Vec_IntFree(vRefs);
    pVVar5 = Vec_MemAllocForTT(6,0);
    p_00->vTtMem = pVVar5;
    pVVar6 = Vec_WecAlloc(1000);
    p_00->vTt2Match = pVVar6;
    Vec_WecPushLevel(p_00->vTt2Match);
    Vec_WecPushLevel(p_00->vTt2Match);
    iVar1 = Vec_WecSize(p_00->vTt2Match);
    iVar2 = Vec_MemEntryNum(p_00->vTtMem);
    if (iVar1 == iVar2) {
      Nf_StoDeriveMatches(p_00,0);
      p_00->InvDelay = p_00->pCells[3].Delays[0];
      p_00->InvArea = p_00->pCells[3].Area;
      pNVar7 = Nf_ObjMatchD(p_00,0,0);
      *(uint *)pNVar7 = *(uint *)pNVar7 & 0xfff00000;
      pNVar7 = Nf_ObjMatchD(p_00,0,1);
      *(uint *)pNVar7 = *(uint *)pNVar7 & 0xfff00000 | 1;
      return p_00;
    }
    __assert_fail("Vec_WecSize(p->vTt2Match) == Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x198,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                ,0x175,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_WrdFill( &p->vRequired, 2*Gia_ManObjNum(pGia), NF_INFINITY );  // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    p->vTtMem    = Vec_MemAllocForTT( 6, 0 );          
    p->vTt2Match = Vec_WecAlloc( 1000 ); 
    Vec_WecPushLevel( p->vTt2Match );
    Vec_WecPushLevel( p->vTt2Match );
    assert( Vec_WecSize(p->vTt2Match) == Vec_MemEntryNum(p->vTtMem) );
    Nf_StoDeriveMatches( p, 0 );//pPars->fVerbose );
    p->InvDelay = p->pCells[3].Delays[0];
    p->InvArea  = p->pCells[3].Area;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}